

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorhulls.cpp
# Opt level: O3

ImVec2 VHRotateV(ImVec2 v,ImVec2 o,double theta)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar7 = (double)(v.x - o.x);
  dVar2 = (double)(v.y - o.y);
  dVar3 = cos(theta);
  dVar4 = sin(theta);
  dVar5 = sin(theta);
  dVar6 = cos(theta);
  IVar1.y = (float)((double)o.y + dVar5 * dVar7 + dVar6 * dVar2);
  IVar1.x = (float)((double)o.x + dVar3 * dVar7 + -dVar4 * dVar2);
  return IVar1;
}

Assistant:

ImVec2 VHRotateV(ImVec2 v, ImVec2 o, double theta) {
	double tx, ty, ttx, tty;

	tx = v.x - o.x;
	ty = v.y - o.y;

	// With not a lot of parts on the boards, we can get away with using the
	// precision trig functions, might have to change to LUT based later.
	ttx = tx * cos(theta) - ty * sin(theta);
	tty = tx * sin(theta) + ty * cos(theta);

	return ImVec2(ttx + o.x, tty + o.y);
}